

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O1

any * __thiscall Json::operator[](Json *this,int index)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  
  bVar1 = is_array(this);
  if (!bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__bad_cast_00156f70;
    __cxa_throw(puVar3,&std::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  plVar2 = (long *)std::__any_caster<std::vector<std::any,std::allocator<std::any>>>(&this->_data);
  if (plVar2 != (long *)0x0) {
    return (any *)((long)index * 0x10 + *plVar2);
  }
  std::__throw_bad_any_cast();
}

Assistant:

std::any &operator[](int index) {
        if (this->is_array()) {
            auto &data =
                    std::any_cast<std::vector<std::any> &>(_data);
            return data[index];
        } else {
            throw std::bad_any_cast();
        }
    }